

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

void ecpNegJ(word *b,word *a,ec_o *ec,void *stack)

{
  size_t n;
  
  n = ec->f->n;
  wwCopy(b,a,n);
  zzNegMod(b + n,a + n,ec->f->mod,ec->f->n);
  wwCopy(b + n + n,a + n + n,ec->f->n);
  return;
}

Assistant:

static void ecpNegJ(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	// pre
	ASSERT(ecIsOperable(ec) && ec->d == 3);
	ASSERT(ecpSeemsOn3(a, ec));
	ASSERT(wwIsSameOrDisjoint(a, b, 3 * n));
	// xb <- xa
	qrCopy(ecX(b), ecX(a), ec->f);
	// yb <- -ya
	zmNeg(ecY(b, n), ecY(a, n), ec->f);
	// zb <- za
	qrCopy(ecZ(b, n), ecZ(a, n), ec->f);
}